

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

string * __thiscall
front::irGenerator::irGenerator::getStringName_abi_cxx11_
          (string *__return_storage_ptr__,irGenerator *this,uint32_t id)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->_StringNamePrefix,"_");
  std::__cxx11::to_string(&local_50,id);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string irGenerator::getStringName(uint32_t id) {
  return _StringNamePrefix + "_" + std::to_string(id);
}